

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar2;
  uint newSize;
  bool bVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 *puVar6;
  SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *dst;
  int *piVar7;
  int iVar8;
  long lVar9;
  uint bucketCount;
  size_t requestedBytes;
  int *local_40;
  int *newBuckets;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (bucketCount = uVar1 & 0x7fffffff, (uVar1 - 1 & bucketCount) != 0)) {
    iVar8 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar8 ^ 0x1f) & 0x1f);
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    if (newSize == 0) {
      dst = (SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *)&DAT_00000008;
    }
    else {
      this_00 = &this->alloc->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (int)newSize) {
        requestedBytes = (ulong)newSize << 3;
      }
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00f180d1;
        *puVar6 = 0;
      }
      dst = (SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal(this_00,requestedBytes);
      memset(dst,0,requestedBytes);
      memset((char *)((long)&(dst->
                             super_DefaultHashedEntry<Wasm::WasmOp,_Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                             ).super_ImplicitKeyValueEntry<Wasm::WasmOp,_Wasm::WasmOp>.
                             super_ValueEntry<Wasm::WasmOp,_JsUtil::(anonymous_namespace)::ValueEntryData<Wasm::WasmOp>_>
                             .super_ValueEntryData<Wasm::WasmOp>.value + requestedBytes),0,
             (requestedBytes + 0xf & 0xfffffffffffffff0) - requestedBytes);
      if (dst == (SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_00f180d1:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        dst = (SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *)0x0;
      }
    }
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Wasm::WasmOp,Wasm::WasmOp>,Wasm::WasmOp,Memory::ArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<Wasm::WasmOp,Wasm::WasmOp>,Wasm::WasmOp,Memory::ArenaAllocator>
              ((SimpleHashedEntry<Wasm::WasmOp,_Wasm::WasmOp> *)newBuckets,(long)(int)newSize,
               this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar8 = this->count;
    if (0 < iVar8) {
      lVar9 = 0;
      piVar7 = newBuckets;
      do {
        if (-2 < piVar7[lVar9 * 2 + 1]) {
          uVar5 = GetBucket((uint)*(ushort *)(piVar7 + lVar9 * 2) * 2 + 1,bucketCount,
                            this->modFunctionIndex);
          newBuckets[lVar9 * 2 + 1] = local_40[(int)uVar5];
          local_40[(int)uVar5] = (int)lVar9;
          iVar8 = this->count;
          piVar7 = newBuckets;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar8);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }